

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O2

string * __thiscall
cmCryptoHashMD5::Finalize_abi_cxx11_(string *__return_storage_ptr__,cmCryptoHashMD5 *this)

{
  char md5out [32];
  char acStack_38 [32];
  undefined1 local_18 [8];
  
  cmsysMD5_FinalizeHex(this->MD5,acStack_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_38,local_18);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHashMD5::Finalize()
{
  char md5out[32];
  cmsysMD5_FinalizeHex(this->MD5, md5out);
  return std::string(md5out, 32);
}